

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O0

void __thiscall
UnifiedRegex::CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::Set
          (CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *this,ArenaAllocator *allocator,
          Char kc,int v)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  Inner *this_00;
  TrackAllocData local_50;
  uint local_24;
  uint local_20;
  uint k;
  int v_local;
  Char kc_local;
  ArenaAllocator *allocator_local;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *this_local;
  
  local_20 = v;
  k._2_2_ = kc;
  _v_local = &allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  allocator_local = (ArenaAllocator *)this;
  local_24 = Chars<char16_t>::CTU(kc);
  pAVar1 = _v_local;
  if (local_24 < 0x100) {
    BVStatic<256UL>::Set(&this->isInMap,local_24);
    this->directMap[local_24] = local_20;
  }
  else {
    if (this->root == (Type)0x0) {
      if (local_20 == this->defv) {
        return;
      }
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_50,
                 (type_info *)&CharMap<char16_t,int,(UnifiedRegex::CharMapScheme)1>::Inner::typeinfo
                 ,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharMap.h"
                 ,0x10f);
      pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar1,&local_50);
      this_00 = (Inner *)new<Memory::ArenaAllocator>(0x88,(ArenaAllocator *)pAVar1,0x3f67b0);
      Inner::Inner(this_00);
      this->root = (Type)this_00;
    }
    (*this->root->_vptr_Node[1])
              (this->root,_v_local,(ulong)(uint)this->defv,3,(ulong)local_24,(ulong)local_20);
  }
  return;
}

Assistant:

void Set(ArenaAllocator* allocator, Char kc, V v)
        {
            uint k = CTU(kc);
            if (k < directSize)
            {
                isInMap.Set(k);
                directMap[k] = v;
            }
            else
            {
                if (root == 0)
                {
                    if (v == defv)
                        return;
                    root = Anew(allocator, Inner);
                }
                root->Set(allocator, defv, levels - 1, k, v);
            }
        }